

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::anon_unknown_26::AssertionPrinter::printRemainingMessages(AssertionPrinter *this,Code colour)

{
  pointer pMVar1;
  ostream *poVar2;
  pointer pMVar3;
  char local_51;
  undefined1 local_50 [16];
  size_type local_40;
  ColourGuard local_38;
  
  pMVar3 = (this->itMessage)._M_current;
  pMVar1 = (this->messages->
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar3 != pMVar1) {
    poVar2 = this->stream;
    local_38.m_colourImpl = this->colourImpl;
    local_38.m_engaged = false;
    local_38.m_code = colour;
    ColourImpl::ColourGuard::engageImpl(&local_38,poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," with ",6);
    local_50._0_8_ = ((long)pMVar1 - (long)pMVar3 >> 3) * -0x71c71c71c71c71c7;
    local_50._8_8_ = "message";
    local_40 = 7;
    operator<<(poVar2,(pluralise *)local_50);
    local_51 = ':';
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_51,1);
    if (local_38.m_engaged == true) {
      (*(local_38.m_colourImpl)->_vptr_ColourImpl[2])(local_38.m_colourImpl,0);
    }
    pMVar3 = (this->itMessage)._M_current;
    if (pMVar3 != pMVar1) {
      do {
        if ((this->printInfoMessages == false) && (pMVar3->type == Info)) {
          (this->itMessage)._M_current = pMVar3 + 1;
        }
        else {
          printMessage(this);
          if ((this->itMessage)._M_current != pMVar1) {
            poVar2 = this->stream;
            local_50._0_8_ = this->colourImpl;
            local_50._8_5_ = 0x17;
            ColourImpl::ColourGuard::engageImpl((ColourGuard *)local_50,poVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2," and",4);
            if (local_50[0xc] == true) {
              (*(*(_func_int ***)local_50._0_8_)[2])(local_50._0_8_,0);
            }
          }
        }
        pMVar3 = (this->itMessage)._M_current;
      } while (pMVar3 != pMVar1);
    }
  }
  return;
}

Assistant:

void printRemainingMessages(Colour::Code colour = compactDimColour) {
        if (itMessage == messages.end())
            return;

        const auto itEnd = messages.cend();
        const auto N = static_cast<std::size_t>(itEnd - itMessage);

        stream << colourImpl->guardColour( colour ) << " with "
               << pluralise( N, "message"_sr ) << ':';

        while (itMessage != itEnd) {
            // If this assertion is a warning ignore any INFO messages
            if (printInfoMessages || itMessage->type != ResultWas::Info) {
                printMessage();
                if (itMessage != itEnd) {
                    stream << colourImpl->guardColour(compactDimColour) << " and";
                }
                continue;
            }
            ++itMessage;
        }
    }